

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tccpp.c
# Opt level: O3

void define_print(TCCState *s1,int v)

{
  int v_00;
  Sym *pSVar1;
  FILE *pFVar2;
  char *pcVar3;
  int *piVar4;
  int iVar5;
  long lVar6;
  Sym *pSVar7;
  int *piVar8;
  long lVar9;
  CValue local_48;
  
  if (((v - 0x100U < tok_ident - 0x100U) &&
      (pSVar1 = table_ident[(int)(v - 0x100U)]->sym_define, pSVar1 != (Sym *)0x0)) &&
     ((pSVar1->field_3).enum_val != 0)) {
    pFVar2 = (FILE *)s1->ppfp;
    pcVar3 = get_tok_str(v,(CValue *)0x0);
    fprintf(pFVar2,"#define %s",pcVar3);
    if ((pSVar1->type).t == 1) {
      pSVar7 = (pSVar1->field_5).next;
      fputc(0x28,pFVar2);
      if (pSVar7 != (Sym *)0x0) {
        while( true ) {
          pcVar3 = get_tok_str(pSVar7->v & 0xdfffffff,(CValue *)0x0);
          fputs(pcVar3,pFVar2);
          pSVar7 = (pSVar7->field_5).next;
          if (pSVar7 == (Sym *)0x0) break;
          fputc(0x2c,pFVar2);
        }
      }
      fputc(0x29,pFVar2);
    }
    piVar8 = (pSVar1->field_3).d;
    pFVar2 = (FILE *)tcc_state->ppfp;
    fputs("",pFVar2);
    if (piVar8 != (int *)0x0) {
      lVar9 = 0;
      do {
        piVar4 = piVar8 + 1;
        v_00 = *piVar8;
        switch(v_00) {
        case 0xb3:
        case 0xb4:
        case 0xb5:
        case 0xc0:
          local_48.d = (double)(long)piVar8[1];
          goto LAB_001268dd;
        case 0xb6:
          local_48.d = (double)(ulong)(uint)piVar8[1];
LAB_001268dd:
          piVar4 = piVar8 + 2;
          break;
        case 0xb7:
        case 0xb8:
        case 0xbc:
        case 0xce:
        case 0xcf:
          iVar5 = 2;
          goto LAB_001268b5;
        case 0xb9:
        case 0xba:
        case 0xbe:
        case 0xbf:
          local_48.str.data = piVar8 + 2;
          local_48.str.size = piVar8[1];
          piVar4 = (int *)((long)piVar8 + ((long)piVar8[1] + 3U & 0xfffffffffffffffc) + 8);
          break;
        case 0xbb:
          piVar4 = piVar8 + 2;
          local_48.f = (float)piVar8[1];
          break;
        case 0xbd:
          iVar5 = 4;
LAB_001268b5:
          lVar6 = 0;
          do {
            *(undefined4 *)((long)&local_48 + lVar6) = *(undefined4 *)((long)piVar4 + lVar6);
            lVar6 = lVar6 + 4;
          } while (iVar5 << 2 != (int)lVar6);
          piVar4 = (int *)((long)piVar4 + lVar6);
switchD_001268ae_caseD_c1:
          if (v_00 == 0) goto LAB_00126959;
          break;
        default:
          goto switchD_001268ae_caseD_c1;
        }
        pcVar3 = get_tok_str(v_00,&local_48);
        fprintf(pFVar2,"field not found: %s" + lVar9 + 0x10,pcVar3);
        lVar9 = 1;
        piVar8 = piVar4;
      } while (piVar4 != (int *)0x0);
    }
LAB_00126959:
    fputc(10,pFVar2);
  }
  return;
}

Assistant:

static void define_print(TCCState* s1, int v) {
  FILE* fp;
  Sym* s;

  s = define_find(v);
  if (NULL == s || NULL == s->d)
    return;

  fp = s1->ppfp;
  fprintf(fp, "#define %s", get_tok_str(v, NULL));
  if (s->type.t == MACRO_FUNC) {
    Sym* a = s->next;
    fprintf(fp, "(");
    if (a)
      for (;;) {
        fprintf(fp, "%s", get_tok_str(a->v & ~SYM_FIELD, NULL));
        if (!(a = a->next))
          break;
        fprintf(fp, ",");
      }
    fprintf(fp, ")");
  }
  tok_print("", s->d);
}